

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search_sequencetask.cc
# Opt level: O0

void SequenceTaskCostToGo::run(search *sch,multi_ex *ec)

{
  ulong uVar1;
  ulong uVar2;
  action aVar3;
  unsigned_long *puVar4;
  float *__ptr;
  size_type sVar5;
  reference ppeVar6;
  vector<example_*,_std::allocator<example_*>_> *in_RSI;
  search *in_RDI;
  size_t in_stack_00000018;
  action in_stack_00000024;
  search *in_stack_00000028;
  size_t prediction;
  size_t k;
  action oracle;
  size_t i;
  predictor P;
  float *costs;
  size_t K;
  example *in_stack_fffffffffffffe48;
  predictor *in_stack_fffffffffffffe50;
  stringstream *in_stack_fffffffffffffe58;
  undefined7 in_stack_fffffffffffffe60;
  byte in_stack_fffffffffffffe67;
  string local_158 [48];
  ulong local_128;
  ulong local_120;
  uint32_t local_114;
  int local_110;
  ptag my_tag;
  search *in_stack_fffffffffffffef8;
  example *in_stack_ffffffffffffff00;
  predictor *in_stack_ffffffffffffff28;
  
  my_tag = (ptag)(_local_110 >> 0x20);
  puVar4 = Search::search::get_task_data<unsigned_long>(in_RDI);
  uVar1 = *puVar4;
  __ptr = calloc_or_throw<float>(in_stack_00000018);
  Search::predictor::predictor
            ((predictor *)in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,my_tag);
  for (_local_110 = 0; uVar2 = _local_110,
      sVar5 = std::vector<example_*,_std::allocator<example_*>_>::size(in_RSI), uVar2 < sVar5;
      _local_110 = _local_110 + 1) {
    ppeVar6 = std::vector<example_*,_std::allocator<example_*>_>::operator[](in_RSI,_local_110);
    local_114 = ((*ppeVar6)->l).multi.label;
    for (local_120 = 0; local_120 < uVar1; local_120 = local_120 + 1) {
      __ptr[local_120] = 1.0;
    }
    __ptr[local_114 - 1] = 0.0;
    Search::predictor::set_tag((predictor *)&stack0xfffffffffffffef8,local_110 + 1);
    std::vector<example_*,_std::allocator<example_*>_>::operator[](in_RSI,_local_110);
    Search::predictor::set_input(in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
    Search::predictor::set_allowed
              ((predictor *)CONCAT17(in_stack_fffffffffffffe67,in_stack_fffffffffffffe60),
               (action *)in_stack_fffffffffffffe58,(float *)in_stack_fffffffffffffe50,
               (size_t)in_stack_fffffffffffffe48);
    Search::search::get_history_length(in_RDI);
    Search::predictor::set_condition_range
              ((predictor *)CONCAT17(in_stack_fffffffffffffe67,in_stack_fffffffffffffe60),
               (ptag)((ulong)in_stack_fffffffffffffe58 >> 0x20),(ptag)in_stack_fffffffffffffe58,
               (char)((ulong)in_stack_fffffffffffffe50 >> 0x38));
    aVar3 = Search::predictor::predict(in_stack_ffffffffffffff28);
    local_128 = (ulong)aVar3;
    Search::search::output_abi_cxx11_(in_RDI);
    in_stack_fffffffffffffe67 = std::ios::good();
    if ((in_stack_fffffffffffffe67 & 1) != 0) {
      in_stack_fffffffffffffe58 = Search::search::output_abi_cxx11_(in_RDI);
      in_stack_fffffffffffffe50 = (predictor *)(in_stack_fffffffffffffe58 + 0x10);
      Search::search::pretty_label_abi_cxx11_(in_stack_00000028,in_stack_00000024);
      in_stack_fffffffffffffe48 =
           (example *)std::operator<<((ostream *)in_stack_fffffffffffffe50,local_158);
      std::operator<<((ostream *)in_stack_fffffffffffffe48,' ');
      std::__cxx11::string::~string(local_158);
    }
  }
  free(__ptr);
  Search::predictor::~predictor(in_stack_fffffffffffffe50);
  return;
}

Assistant:

void run(Search::search& sch, multi_ex& ec)
{
  size_t K = *sch.get_task_data<size_t>();
  float* costs = calloc_or_throw<float>(K);
  Search::predictor P(sch, (ptag)0);
  for (size_t i = 0; i < ec.size(); i++)
  {
    action oracle = ec[i]->l.multi.label;
    for (size_t k = 0; k < K; k++) costs[k] = 1.;
    costs[oracle - 1] = 0.;
    size_t prediction = P.set_tag((ptag)i + 1)
                            .set_input(*ec[i])
                            .set_allowed(nullptr, costs, K)
                            .set_condition_range((ptag)i, sch.get_history_length(), 'p')
                            .predict();
    if (sch.output().good())
      sch.output() << sch.pretty_label((uint32_t)prediction) << ' ';
  }
  free(costs);
}